

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixpoint.cpp
# Opt level: O2

int32_t fix_Div(int32_t i,int32_t j,int32_t q)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  dVar2 = ldexp(1.0,q);
  dVar3 = ldexp(1.0,q);
  auVar1._8_8_ = (double)j;
  auVar1._0_8_ = (double)i;
  auVar4._8_8_ = dVar3;
  auVar4._0_8_ = dVar2;
  auVar4 = divpd(auVar1,auVar4);
  dVar2 = ldexp(1.0,q);
  dVar2 = round(dVar2 * (auVar4._0_8_ / auVar4._8_8_));
  return (int)dVar2;
}

Assistant:

int32_t fix_Div(int32_t i, int32_t j, int32_t q)
{
	return double2fix(fix2double(i, q) / fix2double(j, q), q);
}